

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.hpp
# Opt level: O2

string * __thiscall
httplib::Request::get_header_value_abi_cxx11_
          (string *__return_storage_ptr__,Request *this,char *key,size_t id)

{
  char *__s;
  allocator<char> local_9;
  
  __s = detail::get_header_value(&this->headers,key,id,"");
  std::__cxx11::string::string<std::allocator<char>>((string *)__return_storage_ptr__,__s,&local_9);
  return __return_storage_ptr__;
}

Assistant:

inline std::string Request::get_header_value(const char* key, size_t id) const {
        return detail::get_header_value(headers, key, id, "");
    }